

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_public.c
# Opt level: O3

void nhr_request_cancel(nhr_request request)

{
  if (request == (nhr_request)0x0) {
    return;
  }
  if (request->work_thread != (nhr_thread)0x0) {
    nhr_request_set_command(request,9999);
    return;
  }
  nhr_request_close(request);
  nhr_request_delete(request);
  return;
}

Assistant:

void nhr_request_cancel(nhr_request request) {
	if (request) {
		if (request->work_thread) {
			nhr_request_set_command(request, NHR_COMMAND_END);
			return; // automaticaly deleted before exit work thread function.
		}
		
		nhr_request_close(request);
		nhr_request_delete(request);
	}
}